

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O2

size_type __thiscall avro::detail::BufferImpl::wroteTo(BufferImpl *this,size_type size)

{
  _Elt_pointer pCVar1;
  size_type sVar2;
  ulong size_00;
  
  for (sVar2 = size; sVar2 != 0; sVar2 = sVar2 - size_00) {
    pCVar1 = (this->writeChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    size_00 = (long)pCVar1->endPos_ - (long)pCVar1->writePos_;
    if (sVar2 < size_00) {
      size_00 = sVar2;
    }
    postWrite(this,size_00);
  }
  return size;
}

Assistant:

size_type wroteTo(size_type size) 
    {
        assert(size <= freeSpace_);
        size_type bytesLeft = size;
        while (bytesLeft) {

            Chunk &chunk = writeChunks_.front();
            size_type wrote = std::min<size_type>(chunk.freeSize(), bytesLeft);
            assert(wrote);
            postWrite(wrote);
            bytesLeft -= wrote;
        }
        return size;
    }